

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

bool __thiscall
GF2::MP<135UL,_GF2::MOLex<135UL>_>::operator!=(MP<135UL,_GF2::MOLex<135UL>_> *this,bool cRight)

{
  bool bVar1;
  size_t sVar2;
  WW<135UL> *this_00;
  byte in_SIL;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  byte bVar3;
  
  if ((in_SIL & 1) == 0) {
    sVar2 = Size((MP<135UL,_GF2::MOLex<135UL>_> *)0x17d4e7);
    bVar3 = sVar2 != 0;
  }
  else {
    sVar2 = Size((MP<135UL,_GF2::MOLex<135UL>_> *)0x17d49d);
    bVar3 = 1;
    if (sVar2 == 1) {
      std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::begin
                ((list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_> *)
                 CONCAT17(1,CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)));
      this_00 = &std::_List_const_iterator<GF2::MM<135UL>_>::operator->
                           ((_List_const_iterator<GF2::MM<135UL>_> *)0x17d4c5)->super_WW<135UL>;
      bVar1 = WW<135UL>::IsAllZero(this_00);
      bVar3 = bVar1 ^ 0xff;
    }
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool operator!=(bool cRight) const
	{	
		return cRight ? Size() != 1 || !begin()->IsAllZero() : Size() != 0;
	}